

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix_command.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer piVar1;
  Option *this;
  ostream *poVar2;
  pointer pbVar3;
  pointer piVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  more_comms;
  vector<int,_std::allocator<int>_> vals;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> com;
  string local_260;
  string local_240;
  string local_220;
  App app;
  
  std::__cxx11::string::string((string *)&local_220,"Prefix command app",(allocator *)&com);
  CLI::App::App(&app,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  app.prefix_command_ = true;
  vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_240,"--vals,-v",(allocator *)&com);
  std::__cxx11::string::string((string *)&local_260,"",(allocator *)&more_comms);
  this = CLI::App::add_option<int>(&app,&local_240,&vals,&local_260);
  CLI::Option::expected(this,1);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  CLI::App::parse(&app,argc,argv);
  CLI::App::remaining_abi_cxx11_(&more_comms,&app,false);
  std::operator<<((ostream *)&std::cout,"Prefix:");
  piVar1 = vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar4 = vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar4 != piVar1; piVar4 = piVar4 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
    std::operator<<(poVar2,":");
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar2,"Remaining commands: ");
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (more_comms.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             more_comms.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  for (pbVar3 = more_comms.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != more_comms.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&com,(string *)pbVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&com);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string((string *)&com);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&more_comms);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vals.super__Vector_base<int,_std::allocator<int>_>);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("Prefix command app");
    app.prefix_command();

    std::vector<int> vals;
    app.add_option("--vals,-v", vals)->expected(1);

    CLI11_PARSE(app, argc, argv);

    std::vector<std::string> more_comms = app.remaining();

    std::cout << "Prefix:";
    for(int v : vals)
        std::cout << v << ":";

    std::cout << std::endl << "Remaining commands: ";

    // Perfer to loop over from beginning, not "pop" order
    std::reverse(std::begin(more_comms), std::end(more_comms));
    for(auto com : more_comms)
        std::cout << com << " ";
    std::cout << std::endl;

    return 0;
}